

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffcnvthdr2str(fitsfile *fptr,int exclude_comm,char **exclist,int nexc,char **header,int *nkeys,
                 int *status)

{
  int iVar1;
  fitsfile *local_40;
  int *local_38;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    local_38 = nkeys;
    iVar1 = fits_is_compressed_image(fptr,status);
    if (iVar1 == 0) {
      ffhdr2str(fptr,exclude_comm,exclist,nexc,header,local_38,status);
    }
    else {
      iVar1 = ffinit(&local_40,"mem://",status);
      if (iVar1 < 1) {
        iVar1 = fits_img_decompress_header(fptr,local_40,status);
        if (iVar1 < 1) {
          ffhdr2str(local_40,exclude_comm,exclist,nexc,header,local_38,status);
          ffclos(local_40,status);
        }
        else {
          ffdelt(local_40,status);
        }
      }
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffcnvthdr2str( fitsfile *fptr,  /* I - FITS file pointer                    */
            int exclude_comm,   /* I - if TRUE, exclude commentary keywords */
            char **exclist,     /* I - list of excluded keyword names       */
            int nexc,           /* I - number of names in exclist           */
            char **header,      /* O - returned header string               */
            int *nkeys,         /* O - returned number of 80-char keywords  */
            int  *status)       /* IO - error status                        */
/*
  Same as ffhdr2str, except that if the input HDU is a tile compressed image
  (stored in a binary table) then it will first convert that header back
  to that of a normal uncompressed FITS image before concatenating the header
  keyword records.
*/
{
    fitsfile *tempfptr;
    
    if (*status > 0)
        return(*status);

    if (fits_is_compressed_image(fptr, status) )
    {
        /* this is a tile compressed image, so need to make an uncompressed */
	/* copy of the image header in memory before concatenating the keywords */
        if (fits_create_file(&tempfptr, "mem://", status) > 0) {
	    return(*status);
	}

	if (fits_img_decompress_header(fptr, tempfptr, status) > 0) {
	    fits_delete_file(tempfptr, status);
	    return(*status);
	}

	ffhdr2str(tempfptr, exclude_comm, exclist, nexc, header, nkeys, status);
	fits_close_file(tempfptr, status);

    } else {
        ffhdr2str(fptr, exclude_comm, exclist, nexc, header, nkeys, status);
    }

    return(*status);
}